

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManGetCurrentMapping(Sbl_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  size_t __size;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  pVVar2 = p->vWindow;
  iVar1 = pVVar2->nSize;
  if (0 < (long)iVar1) {
    pVVar7 = pVVar2->pArray;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&pVVar7->nSize + lVar9) = 0;
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar9);
  }
  pVVar2->nSize = 0;
  iVar1 = p->vAnds->nSize;
  if (pVVar2->nCap < iVar1) {
    __size = (long)iVar1 << 4;
    if (pVVar2->pArray == (Vec_Int_t *)0x0) {
      pVVar7 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar7 = (Vec_Int_t *)realloc(pVVar2->pArray,__size);
    }
    pVVar2->pArray = pVVar7;
    memset(pVVar7 + pVVar2->nCap,0,((long)iVar1 - (long)pVVar2->nCap) * 0x10);
    pVVar2->nCap = iVar1;
  }
  pVVar2->nSize = iVar1;
  if (p->vSolCur->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSolCur) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x10c,"void Sbl_ManGetCurrentMapping(Sbl_Man_t *)");
  }
  pVVar7 = p->vSolCur;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      iVar1 = pVVar7->pArray[lVar9];
      lVar8 = (long)iVar1;
      if ((((lVar8 < 0) || (p->vCutsI1->nSize <= iVar1)) || (p->vCutsI2->nSize <= iVar1)) ||
         ((p->vCutsN1->nSize <= iVar1 || (p->vCutsN2->nSize <= iVar1)))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (p->vCutsObj->nSize <= iVar1) {
LAB_0074c542:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCutsObj->pArray[lVar8];
      lVar10 = (long)iVar1;
      if ((lVar10 < 0) || (p->vWindow->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar12 = p->vCutsI1->pArray[lVar8];
      uVar3 = p->vCutsI2->pArray[lVar8];
      uVar4 = p->vCutsN1->pArray[lVar8];
      uVar5 = p->vCutsN2->pArray[lVar8];
      pVVar6 = p->vWindow->pArray;
      pVVar7 = pVVar6 + lVar10;
      pVVar6[lVar10].nSize = 0;
      uVar11 = 0;
      do {
        if ((uVar12 >> (uVar11 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)uVar11) goto LAB_0074c542;
          Vec_IntPush(pVVar7,p->vLeaves->pArray[uVar11]);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x40);
      uVar12 = 0;
      do {
        if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)(uVar12 + 0x40)) goto LAB_0074c542;
          Vec_IntPush(pVVar7,p->vLeaves->pArray[uVar12 + 0x40]);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x40);
      uVar12 = 0;
      do {
        if ((uVar4 >> (uVar12 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)uVar12) goto LAB_0074c542;
          Vec_IntPush(pVVar7,p->vAnds->pArray[uVar12]);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x40);
      uVar12 = 0;
      do {
        if ((uVar5 >> (uVar12 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)(uVar12 + 0x40)) goto LAB_0074c542;
          Vec_IntPush(pVVar7,p->vAnds->pArray[uVar12 + 0x40]);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x40);
      lVar9 = lVar9 + 1;
      pVVar7 = p->vSolCur;
    } while (lVar9 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Sbl_ManGetCurrentMapping( Sbl_Man_t * p )
{
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj;
    Vec_WecClear( p->vWindow );
    Vec_WecInit( p->vWindow, Vec_IntSize(p->vAnds) );
    assert( Vec_IntSize(p->vSolCur) > 0 );
    Vec_IntForEachEntry( p->vSolCur, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj  = Vec_IntEntry( p->vCutsObj, c );
        //iObj  = Vec_IntEntry( p->vAnds, iObj );
        vObj  = Vec_WecEntry( p->vWindow, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
    }
}